

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly.cpp
# Opt level: O1

void __thiscall poly::poly(poly *this,size_t bits,istream *ss)

{
  pointer puVar1;
  size_type __n;
  
  (this->x).
  super__Safe_container<std::__debug::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<unsigned_int>,___gnu_debug::_Safe_sequence,_true>
  .super__Safe_sequence<std::__debug::vector<unsigned_int,_std::allocator<unsigned_int>_>_>.
  super__Safe_sequence_base._M_iterators = (_Safe_iterator_base *)0x0;
  (this->x).
  super__Safe_container<std::__debug::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<unsigned_int>,___gnu_debug::_Safe_sequence,_true>
  .super__Safe_sequence<std::__debug::vector<unsigned_int,_std::allocator<unsigned_int>_>_>.
  super__Safe_sequence_base._M_const_iterators = (_Safe_iterator_base *)0x0;
  (this->x).
  super__Safe_container<std::__debug::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<unsigned_int>,___gnu_debug::_Safe_sequence,_true>
  .super__Safe_sequence<std::__debug::vector<unsigned_int,_std::allocator<unsigned_int>_>_>.
  super__Safe_sequence_base._M_version = 1;
  (this->x).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->x).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->x).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->x).
  super__Safe_vector<std::__debug::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx1998::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  ._M_guaranteed_capacity = 0;
  puVar1 = (this->x).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar1 != (pointer)0x0) {
    (this->x).
    super__Safe_vector<std::__debug::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx1998::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ._M_guaranteed_capacity = (long)puVar1 >> 2;
  }
  std::__debug::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&this->x,bits >> 5);
  if (0x1f < bits) {
    __n = 0;
    do {
      *(uint *)(ss + *(long *)(*(long *)ss + -0x18) + 0x18) =
           *(uint *)(ss + *(long *)(*(long *)ss + -0x18) + 0x18) & 0xffffffb5 | 8;
      std::__debug::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&this->x,__n);
      std::istream::_M_extract<unsigned_int>((uint *)ss);
      __n = __n + 1;
    } while (bits >> 5 != __n);
  }
  this->_degree = -1;
  return;
}

Assistant:

poly::poly(size_t bits, std::istream &ss) {
    x.resize(bits / 32);
    for (size_t i = 0; i < bits / 32; i++)
        ss >> std::hex >> x[i];
    _degree = -1;
}